

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdquery.cc
# Opt level: O0

void __thiscall bdQueryHistory::bdQueryHistory(bdQueryHistory *this)

{
  bdQueryHistory *this_local;
  
  this->mStorePeriod = 600;
  std::
  map<bdId,_bdQueryHistoryList,_std::less<bdId>,_std::allocator<std::pair<const_bdId,_bdQueryHistoryList>_>_>
  ::map(&this->mHistory);
  return;
}

Assistant:

bdQueryHistory::bdQueryHistory()
    :mStorePeriod(QUERY_HISTORY_PERIOD) {}